

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistence_lanscapes_test.cpp
# Opt level: O0

void __thiscall
check_computations_sum_differences_and_multiplications::test_method
          (check_computations_sum_differences_and_multiplications *this)

{
  undefined8 uVar1;
  bool bVar2;
  unsigned_long number_of_levels;
  lazy_ostream *plVar3;
  basic_cstring<const_char> local_308;
  basic_cstring<const_char> local_2f8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_2e8;
  assertion_result local_2c8;
  basic_cstring<const_char> local_2b0;
  basic_cstring<const_char> local_2a0;
  basic_cstring<const_char> local_290;
  basic_cstring<const_char> local_280;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_270;
  assertion_result local_250;
  basic_cstring<const_char> local_238;
  basic_cstring<const_char> local_228;
  basic_cstring<const_char> local_218;
  basic_cstring<const_char> local_208;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_1f8;
  assertion_result local_1d8;
  basic_cstring<const_char> local_1c0;
  basic_cstring<const_char> local_1b0;
  undefined1 local_1a0 [8];
  Persistence_landscape template_multiply_by_scalar;
  Persistence_landscape template_difference;
  Persistence_landscape template_sum;
  Persistence_landscape multiply_by_scalar;
  Persistence_landscape difference;
  Persistence_landscape sum;
  Persistence_landscape second;
  Persistence_landscape p;
  allocator<char> local_49;
  string local_48;
  undefined1 local_28 [8];
  vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> diag;
  check_computations_sum_differences_and_multiplications *this_local;
  
  diag.super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"data/file_with_diagram",&local_49);
  Gudhi::Persistence_representations::read_persistence_intervals_in_one_dimension_from_file
            ((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *)
             local_28,&local_48,-1,-1.0);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  number_of_levels = std::numeric_limits<unsigned_long>::max();
  Gudhi::Persistence_representations::Persistence_landscape::Persistence_landscape
            ((Persistence_landscape *)&second.number_of_functions_for_projections_to_reals,
             (vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *)
             local_28,number_of_levels);
  Gudhi::Persistence_representations::Persistence_landscape::Persistence_landscape
            ((Persistence_landscape *)&sum.number_of_functions_for_projections_to_reals);
  Gudhi::Persistence_representations::Persistence_landscape::load_landscape_from_file
            ((Persistence_landscape *)&sum.number_of_functions_for_projections_to_reals,
             "data/file_with_landscape_from_file_with_diagram_1");
  Gudhi::Persistence_representations::operator+
            ((Persistence_landscape *)&difference.number_of_functions_for_projections_to_reals,
             (Persistence_landscape *)&second.number_of_functions_for_projections_to_reals,
             (Persistence_landscape *)&sum.number_of_functions_for_projections_to_reals);
  Gudhi::Persistence_representations::operator-
            ((Persistence_landscape *)
             &multiply_by_scalar.number_of_functions_for_projections_to_reals,
             (Persistence_landscape *)&second.number_of_functions_for_projections_to_reals,
             (Persistence_landscape *)&sum.number_of_functions_for_projections_to_reals);
  Gudhi::Persistence_representations::operator*
            ((Persistence_landscape *)&template_sum.number_of_functions_for_projections_to_reals,
             10.0,(Persistence_landscape *)&second.number_of_functions_for_projections_to_reals);
  Gudhi::Persistence_representations::Persistence_landscape::Persistence_landscape
            ((Persistence_landscape *)
             &template_difference.number_of_functions_for_projections_to_reals);
  Gudhi::Persistence_representations::Persistence_landscape::load_landscape_from_file
            ((Persistence_landscape *)
             &template_difference.number_of_functions_for_projections_to_reals,"data/sum");
  Gudhi::Persistence_representations::Persistence_landscape::Persistence_landscape
            ((Persistence_landscape *)
             &template_multiply_by_scalar.number_of_functions_for_projections_to_reals);
  Gudhi::Persistence_representations::Persistence_landscape::load_landscape_from_file
            ((Persistence_landscape *)
             &template_multiply_by_scalar.number_of_functions_for_projections_to_reals,
             "data/difference");
  Gudhi::Persistence_representations::Persistence_landscape::Persistence_landscape
            ((Persistence_landscape *)local_1a0);
  Gudhi::Persistence_representations::Persistence_landscape::load_landscape_from_file
            ((Persistence_landscape *)local_1a0,"data/multiply_by_scalar");
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1b0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_representations/test/persistence_lanscapes_test.cpp"
               ,0x89);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_1c0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_1b0,0x92,&local_1c0);
    bVar2 = Gudhi::Persistence_representations::Persistence_landscape::operator==
                      ((Persistence_landscape *)
                       &difference.number_of_functions_for_projections_to_reals,
                       (Persistence_landscape *)
                       &template_difference.number_of_functions_for_projections_to_reals);
    boost::test_tools::assertion_result::assertion_result(&local_1d8,bVar2);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_208,"sum == template_sum",0x13);
    boost::unit_test::operator<<(&local_1f8,plVar3,&local_208);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_218,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_representations/test/persistence_lanscapes_test.cpp"
               ,0x89);
    boost::test_tools::tt_detail::report_assertion(&local_1d8,&local_1f8,&local_218,0x92,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_1f8);
    boost::test_tools::assertion_result::~assertion_result(&local_1d8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_228,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_representations/test/persistence_lanscapes_test.cpp"
               ,0x89);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_238);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_228,0x93,&local_238);
    bVar2 = Gudhi::Persistence_representations::Persistence_landscape::operator==
                      ((Persistence_landscape *)
                       &multiply_by_scalar.number_of_functions_for_projections_to_reals,
                       (Persistence_landscape *)
                       &template_multiply_by_scalar.number_of_functions_for_projections_to_reals);
    boost::test_tools::assertion_result::assertion_result(&local_250,bVar2);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_280,"difference == template_difference",0x21);
    boost::unit_test::operator<<(&local_270,plVar3,&local_280);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_290,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_representations/test/persistence_lanscapes_test.cpp"
               ,0x89);
    boost::test_tools::tt_detail::report_assertion(&local_250,&local_270,&local_290,0x93,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_270);
    boost::test_tools::assertion_result::~assertion_result(&local_250);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_2a0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_representations/test/persistence_lanscapes_test.cpp"
               ,0x89);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_2b0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_2a0,0x94,&local_2b0);
    bVar2 = Gudhi::Persistence_representations::Persistence_landscape::operator==
                      ((Persistence_landscape *)
                       &template_sum.number_of_functions_for_projections_to_reals,
                       (Persistence_landscape *)local_1a0);
    boost::test_tools::assertion_result::assertion_result(&local_2c8,bVar2);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_2f8,"multiply_by_scalar == template_multiply_by_scalar",0x31);
    boost::unit_test::operator<<(&local_2e8,plVar3,&local_2f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_308,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_representations/test/persistence_lanscapes_test.cpp"
               ,0x89);
    boost::test_tools::tt_detail::report_assertion(&local_2c8,&local_2e8,&local_308,0x94,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_2e8);
    boost::test_tools::assertion_result::~assertion_result(&local_2c8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  Gudhi::Persistence_representations::Persistence_landscape::~Persistence_landscape
            ((Persistence_landscape *)local_1a0);
  Gudhi::Persistence_representations::Persistence_landscape::~Persistence_landscape
            ((Persistence_landscape *)
             &template_multiply_by_scalar.number_of_functions_for_projections_to_reals);
  Gudhi::Persistence_representations::Persistence_landscape::~Persistence_landscape
            ((Persistence_landscape *)
             &template_difference.number_of_functions_for_projections_to_reals);
  Gudhi::Persistence_representations::Persistence_landscape::~Persistence_landscape
            ((Persistence_landscape *)&template_sum.number_of_functions_for_projections_to_reals);
  Gudhi::Persistence_representations::Persistence_landscape::~Persistence_landscape
            ((Persistence_landscape *)
             &multiply_by_scalar.number_of_functions_for_projections_to_reals);
  Gudhi::Persistence_representations::Persistence_landscape::~Persistence_landscape
            ((Persistence_landscape *)&difference.number_of_functions_for_projections_to_reals);
  Gudhi::Persistence_representations::Persistence_landscape::~Persistence_landscape
            ((Persistence_landscape *)&sum.number_of_functions_for_projections_to_reals);
  Gudhi::Persistence_representations::Persistence_landscape::~Persistence_landscape
            ((Persistence_landscape *)&second.number_of_functions_for_projections_to_reals);
  std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::~vector
            ((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *)
             local_28);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(check_computations_sum_differences_and_multiplications) {
  std::vector<std::pair<double, double> > diag =
      read_persistence_intervals_in_one_dimension_from_file("data/file_with_diagram");
  Persistence_landscape p(diag);
  Persistence_landscape second;
  second.load_landscape_from_file("data/file_with_landscape_from_file_with_diagram_1");

  Persistence_landscape sum = p + second;
  Persistence_landscape difference = p - second;
  Persistence_landscape multiply_by_scalar = 10 * p;

  Persistence_landscape template_sum;
  template_sum.load_landscape_from_file("data/sum");

  Persistence_landscape template_difference;
  template_difference.load_landscape_from_file("data/difference");

  Persistence_landscape template_multiply_by_scalar;
  template_multiply_by_scalar.load_landscape_from_file("data/multiply_by_scalar");

  BOOST_CHECK(sum == template_sum);
  BOOST_CHECK(difference == template_difference);
  BOOST_CHECK(multiply_by_scalar == template_multiply_by_scalar);
}